

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiMultiSelectState * __thiscall
ImPool<ImGuiMultiSelectState>::Add(ImPool<ImGuiMultiSelectState> *this)

{
  int i;
  ImGuiMultiSelectState *pIVar1;
  ImVector<ImGuiMultiSelectState> *in_RDI;
  int idx;
  undefined8 in_stack_ffffffffffffffc8;
  ImVector<ImGuiMultiSelectState> *in_stack_ffffffffffffffd0;
  
  i = in_RDI[2].Size;
  if (i == in_RDI->Size) {
    ImVector<ImGuiMultiSelectState>::resize
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    in_RDI[2].Size = in_RDI[2].Size + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiMultiSelectState>::operator[](in_RDI,i);
    in_RDI[2].Size = *(int *)&pIVar1->Window;
  }
  ImVector<ImGuiMultiSelectState>::operator[](in_RDI,i);
  pIVar1 = (ImGuiMultiSelectState *)operator_new(0x28);
  ImGuiMultiSelectState::ImGuiMultiSelectState(pIVar1);
  in_RDI[2].Capacity = in_RDI[2].Capacity + 1;
  pIVar1 = ImVector<ImGuiMultiSelectState>::operator[](in_RDI,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }